

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_destination_over(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint uVar1;
  uint32_t uVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  if (0 < length) {
    uVar4 = (ulong)(uint)length;
  }
  if (const_alpha == 0xff) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = dest[uVar3];
      uVar2 = BYTE_MUL(src[uVar3],~uVar1 >> 0x18);
      dest[uVar3] = uVar2 + uVar1;
    }
  }
  else {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = dest[uVar3];
      uVar2 = BYTE_MUL(src[uVar3],const_alpha);
      uVar2 = BYTE_MUL(uVar2,~uVar1 >> 0x18);
      dest[uVar3] = uVar2 + uVar1;
    }
  }
  return;
}

Assistant:

static void composition_destination_over(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            dest[i] = d + BYTE_MUL(src[i], plutovg_alpha(~d));
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = d + BYTE_MUL(s, plutovg_alpha(~d));
        }
    }
}